

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_spatial.cpp
# Opt level: O3

void __thiscall
embree::sse2::
BVHNBuilderFastSpatialSAH<4,_embree::TriangleMesh,_embree::TriangleMv<4>,_embree::sse2::TriangleSplitterFactory>
::build(BVHNBuilderFastSpatialSAH<4,_embree::TriangleMesh,_embree::TriangleMv<4>,_embree::sse2::TriangleSplitterFactory>
        *this)

{
  mvector<PrimRef> *prims;
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  uint uVar4;
  pointer ppTVar5;
  Device *pDVar6;
  Block *pBVar7;
  PrimRef *pPVar8;
  MemoryMonitorInterface *pMVar9;
  Geometry *pGVar10;
  Scene *pSVar11;
  double dVar12;
  undefined8 uVar13;
  long lVar14;
  TriangleMesh *pTVar15;
  long *plVar16;
  ulong uVar17;
  PrimRef *pPVar18;
  size_t sVar19;
  NodeRef root;
  ulong uVar20;
  long *plVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  ulong uVar23;
  ulong uVar24;
  EVP_PKEY_CTX *ctx;
  __pointer_type pBVar25;
  pointer ppTVar26;
  BVH **ppBVar27;
  BVH *pBVar28;
  size_t sVar29;
  float fVar30;
  PrimInfo pinfo;
  string __str;
  BuildProgressMonitor *in_stack_fffffffffffffe58;
  BuildProgressMonitor *in_stack_fffffffffffffe60;
  byte local_161;
  Scene **local_160;
  Geometry *local_150;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  size_t local_108;
  size_t sStack_100;
  BVH **local_f0;
  size_t *local_e8;
  double local_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  size_t local_58;
  size_t sStack_50;
  undefined **local_40;
  Scene *local_38;
  
  pTVar15 = this->mesh;
  if (pTVar15 == (TriangleMesh *)0x0) {
LAB_00c1df4c:
    sVar19 = (this->scene->world).numTriangles;
    this->numPreviousPrimitives = (uint)sVar19;
    if (sVar19 == 0) goto LAB_00c1dfb6;
    pSVar11 = this->scene;
    sVar29 = (pSVar11->geometries).size_active;
    if (sVar29 == 0) {
      local_150 = (Geometry *)0x0;
    }
    else {
      local_150 = (Geometry *)0x0;
      uVar17 = 0;
      do {
        pGVar10 = (pSVar11->geometries).items[uVar17].ptr;
        if ((((pGVar10 != (Geometry *)0x0) && (((uint)pGVar10->field_8 & 0x2000ff) == 0x200014)) &&
            (pGVar10->numTimeSteps == 1)) && ((uint)local_150 <= (uint)uVar17)) {
          local_150 = (Geometry *)(uVar17 & 0xffffffff);
        }
        uVar17 = uVar17 + 1;
      } while (sVar29 != uVar17);
    }
    local_161 = 0x7ffffff < (uint)local_150 |
                *(byte *)(*(long *)&(pSVar11->super_AccelN).field_0x188 + 0x464);
    pBVar28 = this->bvh;
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct((ulong)local_b8,'\x01');
    *local_b8[0] = 0x34;
    plVar16 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x1f8cf1e);
    local_d8 = &local_c8;
    plVar21 = plVar16 + 2;
    if ((long *)*plVar16 == plVar21) {
      local_c8 = *plVar21;
      lStack_c0 = plVar16[3];
    }
    else {
      local_c8 = *plVar21;
      local_d8 = (long *)*plVar16;
    }
    local_d0 = plVar16[1];
    *plVar16 = (long)plVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_148._0_8_ = &local_138;
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar22) {
      local_138._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_138._8_8_ = plVar16[3];
    }
    else {
      local_138._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_148._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar16;
    }
    local_148._8_8_ = plVar16[1];
    *plVar16 = (long)paVar22;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    bVar3 = true;
  }
  else {
    if ((pTVar15->super_Geometry).numPrimitives != this->numPreviousPrimitives) {
      pBVar28 = this->bvh;
      FastAllocator::internal_fix_used_blocks(&pBVar28->alloc);
      ppTVar26 = (pBVar28->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar5 = (pBVar28->alloc).thread_local_allocators.
                super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar26 != ppTVar5) {
        do {
          FastAllocator::ThreadLocal2::unbind(*ppTVar26,&pBVar28->alloc);
          ppTVar26 = ppTVar26 + 1;
        } while (ppTVar26 != ppTVar5);
        ppTVar26 = (pBVar28->alloc).thread_local_allocators.
                   super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((pBVar28->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppTVar26) {
          (pBVar28->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppTVar26;
        }
      }
      LOCK();
      (pBVar28->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar28->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar28->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      if ((pBVar28->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
        pDVar6 = (pBVar28->alloc).device;
        bVar3 = (pBVar28->alloc).useUSM;
        pBVar25 = (pBVar28->alloc).usedBlocks._M_b._M_p;
        do {
          pBVar7 = pBVar25->next;
          FastAllocator::Block::clear_block(pBVar25,pDVar6,bVar3);
          pBVar25 = pBVar7;
        } while (pBVar7 != (Block *)0x0);
      }
      LOCK();
      (pBVar28->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if ((pBVar28->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
        pDVar6 = (pBVar28->alloc).device;
        bVar3 = (pBVar28->alloc).useUSM;
        pBVar25 = (pBVar28->alloc).freeBlocks._M_b._M_p;
        do {
          pBVar7 = pBVar25->next;
          FastAllocator::Block::clear_block(pBVar25,pDVar6,bVar3);
          pBVar25 = pBVar7;
        } while (pBVar7 != (Block *)0x0);
      }
      LOCK();
      (pBVar28->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar14 = -8;
      do {
        LOCK();
        (pBVar28->alloc).threadBlocks[lVar14]._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        LOCK();
        (pBVar28->alloc).threadBlocks[lVar14 + 8]._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0);
      sVar19 = (pBVar28->alloc).primrefarray.size_alloced;
      pPVar8 = (pBVar28->alloc).primrefarray.items;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar19 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar19 << 5,(pBVar28->alloc).primrefarray.alloc.hugepages);
        }
      }
      if (sVar19 != 0) {
        pMVar9 = (pBVar28->alloc).primrefarray.alloc.device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar19 * -0x20,1);
      }
      (pBVar28->alloc).primrefarray.size_active = 0;
      (pBVar28->alloc).primrefarray.size_alloced = 0;
      (pBVar28->alloc).primrefarray.items = (PrimRef *)0x0;
      pTVar15 = this->mesh;
      if (pTVar15 == (TriangleMesh *)0x0) goto LAB_00c1df4c;
    }
    uVar4 = (pTVar15->super_Geometry).numPrimitives;
    sVar19 = (size_t)uVar4;
    this->numPreviousPrimitives = uVar4;
    if (sVar19 == 0) {
LAB_00c1dfb6:
      sVar19 = (this->prims0).size_alloced;
      pPVar8 = (this->prims0).items;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar19 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar19 << 5,(this->prims0).alloc.hugepages);
        }
      }
      if (sVar19 != 0) {
        pMVar9 = (this->prims0).alloc.device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar19 * -0x20,1);
      }
      (this->prims0).size_active = 0;
      (this->prims0).size_alloced = 0;
      (this->prims0).items = (PrimRef *)0x0;
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      return;
    }
    local_150 = (Geometry *)(ulong)this->geomID_;
    pBVar28 = this->bvh;
    local_161 = 0x7ffffff < this->geomID_ |
                *(byte *)(*(long *)&(this->scene->super_AccelN).field_0x188 + 0x464);
    local_148._0_8_ = &local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
    bVar3 = false;
  }
  local_160 = &this->scene;
  ppBVar27 = &this->bvh;
  local_e0 = BVHN<4>::preBuild(pBVar28,(string *)&local_148.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._0_8_ != &local_138) {
    operator_delete((void *)local_148._0_8_);
  }
  if (bVar3) {
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
  }
  fVar30 = (float)sVar19 * this->splitFactor;
  uVar17 = (ulong)fVar30;
  uVar17 = (long)(fVar30 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17;
  if (uVar17 < sVar19) {
    uVar17 = sVar19;
  }
  uVar20 = (this->prims0).size_alloced;
  uVar24 = uVar20;
  if ((uVar20 < uVar17) && (uVar24 = uVar17, uVar23 = uVar20, uVar20 != 0)) {
    do {
      uVar24 = uVar23 * 2 + (ulong)(uVar23 * 2 == 0);
      uVar23 = uVar24;
    } while (uVar24 < uVar17);
  }
  local_e8 = &(this->prims0).size_active;
  if (uVar17 < (this->prims0).size_active) {
    *local_e8 = uVar17;
  }
  prims = &this->prims0;
  if (uVar20 == uVar24) {
    *local_e8 = uVar17;
    goto LAB_00c1e353;
  }
  pPVar8 = (this->prims0).items;
  local_f0 = ppBVar27;
  if (uVar24 == 0) {
    sVar29 = 0;
LAB_00c1e2a3:
    pPVar18 = (PrimRef *)alignedMalloc(sVar29,0x20);
  }
  else {
    pMVar9 = (prims->alloc).device;
    sVar29 = uVar24 << 5;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar29,0);
    if (sVar29 < 0x1c00000) goto LAB_00c1e2a3;
    pPVar18 = (PrimRef *)os_malloc(sVar29,&(this->prims0).alloc.hugepages);
  }
  (this->prims0).items = pPVar18;
  if ((this->prims0).size_active == 0) {
    sVar29 = (this->prims0).size_alloced;
    if (pPVar8 != (PrimRef *)0x0) goto LAB_00c1e2f7;
  }
  else {
    lVar14 = 0x10;
    uVar20 = 0;
    do {
      pPVar18 = (this->prims0).items;
      puVar1 = (undefined8 *)((long)pPVar8 + lVar14 + -0x10);
      uVar13 = puVar1[1];
      puVar2 = (undefined8 *)((long)pPVar18 + lVar14 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar13;
      puVar2 = (undefined8 *)((long)&(pPVar8->lower).field_0 + lVar14);
      uVar13 = puVar2[1];
      puVar1 = (undefined8 *)((long)&(pPVar18->lower).field_0 + lVar14);
      *puVar1 = *puVar2;
      puVar1[1] = uVar13;
      uVar20 = uVar20 + 1;
      lVar14 = lVar14 + 0x20;
    } while (uVar20 < (this->prims0).size_active);
    sVar29 = (this->prims0).size_alloced;
LAB_00c1e2f7:
    if (sVar29 << 5 < 0x1c00000) {
      alignedFree(pPVar8);
    }
    else {
      os_free(pPVar8,sVar29 << 5,(this->prims0).alloc.hugepages);
    }
  }
  if (sVar29 != 0) {
    pMVar9 = (prims->alloc).device;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar29 * -0x20,1);
  }
  (this->prims0).size_active = uVar17;
  (this->prims0).size_alloced = uVar24;
  ppBVar27 = local_f0;
LAB_00c1e353:
  if (this->mesh != (TriangleMesh *)0x0) {
    ((*ppBVar27)->alloc).atype = EMBREE_OS_MALLOC;
  }
  if (local_161 == 0) {
    if (this->mesh == (TriangleMesh *)0x0) {
      sse2::createPrimRefArray
                ((PrimInfo *)&local_98.field_1,*local_160,MTY_TRIANGLE_MESH,false,uVar17,prims,
                 &((*ppBVar27)->scene->progressInterface).super_BuildProgressMonitor);
    }
    else {
      sse2::createPrimRefArray
                ((PrimInfo *)&local_98.field_1,&this->mesh->super_Geometry,this->geomID_,uVar17,
                 prims,&(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    local_148._0_8_ = local_98._0_8_;
    local_148._8_8_ = local_98._8_8_;
    local_138._M_allocated_capacity = local_88._0_8_;
    local_138._8_8_ = local_88._8_8_;
    local_128 = local_78._0_8_;
    uStack_120 = local_78._8_8_;
    local_118 = local_68._0_8_;
    uStack_110 = local_68._8_8_;
    local_108 = local_58;
    sStack_100 = sStack_50;
    pSVar11 = this->scene;
    dVar12 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 176.0;
    uVar20 = (ulong)dVar12;
    sVar19 = ((long)(dVar12 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20) +
             (sStack_50 - local_58 & 0x1ffffffffffffff) * 8;
    FastAllocator::init_estimate(&this->bvh->alloc,sVar19);
    sVar19 = FastAllocator::fixSingleThreadThreshold
                       (&this->bvh->alloc,4,0x400,sStack_100 - local_108,sVar19);
    (this->settings).singleThreadThreshold = sVar19;
    (this->settings).branchingFactor = 4;
    (this->settings).maxDepth = 0x28;
    local_98._0_8_ = this->bvh;
    local_40 = &PTR_operator___02185a30;
    local_38 = (((BVH *)local_98._0_8_)->scene->progressInterface).scene;
    root.ptr = (size_t)BVHBuilderBinnedFastSpatialSAH::
                       build<embree::NodeRefPtr<4>,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>,embree::sse2::TriangleSplitterFactory,embree::Scene::BuildProgressMonitorInterface>
                                 (&((BVH *)local_98._0_8_)->alloc,&local_98,pSVar11,&local_40,
                                  (this->prims0).items,uVar17,&local_148,&this->settings);
  }
  else {
    if (this->mesh == (TriangleMesh *)0x0) {
      createPrimRefArray_presplit<embree::TriangleMesh,embree::sse2::TriangleSplitterFactory>
                ((PrimInfo *)&local_98.field_1,(sse2 *)*local_160,(Scene *)&Geometry::updateBuffer,
                 ~MTY_ALL,SUB81(sVar19,0),(size_t)prims,
                 (mvector<PrimRef> *)&(*ppBVar27)->scene->progressInterface,
                 in_stack_fffffffffffffe60);
    }
    else {
      createPrimRefArray_presplit<embree::TriangleMesh,embree::sse2::TriangleSplitterFactory>
                ((PrimInfo *)&local_98.field_1,(sse2 *)this->mesh,local_150,(uint)sVar19,
                 (size_t)prims,(mvector<PrimRef> *)&(*ppBVar27)->scene->progressInterface,
                 in_stack_fffffffffffffe58);
    }
    local_148._0_8_ = local_98._0_8_;
    local_148._8_8_ = local_98._8_8_;
    local_138._M_allocated_capacity = local_88._0_8_;
    local_138._8_8_ = local_88._8_8_;
    local_128 = local_78._0_8_;
    uStack_120 = local_78._8_8_;
    local_118 = local_68._0_8_;
    uStack_110 = local_68._8_8_;
    local_108 = local_58;
    sStack_100 = sStack_50;
    dVar12 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 176.0;
    uVar17 = (ulong)dVar12;
    sVar19 = ((long)(dVar12 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17) +
             (sStack_50 - local_58 & 0x1ffffffffffffff) * 8;
    FastAllocator::init_estimate(&this->bvh->alloc,sVar19);
    sVar19 = FastAllocator::fixSingleThreadThreshold
                       (&this->bvh->alloc,4,0x400,sStack_100 - local_108,sVar19);
    (this->settings).singleThreadThreshold = sVar19;
    (this->settings).branchingFactor = 4;
    (this->settings).maxDepth = 0x28;
    local_98._8_8_ = this->bvh;
    local_98._0_8_ = &PTR_createLeaf_0218d760;
    root.ptr = (size_t)BVHNBuilderVirtual<4>::BVHNBuilderV::build
                                 ((BVHNBuilderV *)&local_98.field_1,&((BVH *)local_98._8_8_)->alloc,
                                  &(((BVH *)local_98._8_8_)->scene->progressInterface).
                                   super_BuildProgressMonitor,(this->prims0).items,
                                  (PrimInfo *)&local_148.field_1,this->settings);
  }
  local_98._0_8_ = local_148._0_8_;
  local_98._8_8_ = local_148._8_8_;
  local_88._0_8_ = local_138._M_allocated_capacity;
  local_88._8_8_ = local_138._8_8_;
  local_78._0_8_ = local_148._0_8_;
  local_78._8_8_ = local_148._8_8_;
  local_68._0_8_ = local_138._M_allocated_capacity;
  local_68._8_8_ = local_138._8_8_;
  BVHN<4>::set(*ppBVar27,root,(LBBox3fa *)&local_98.field_1,sStack_100 - local_108);
  fVar30 = (float)(sStack_100 - local_108) * 0.005;
  uVar17 = (ulong)fVar30;
  ctx = (EVP_PKEY_CTX *)((long)(fVar30 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17);
  BVHN<4>::layoutLargeNodes(*ppBVar27,(size_t)ctx);
  if ((*local_160 != (Scene *)0x0) &&
     (((*local_160)->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
    sVar19 = (this->prims0).size_alloced;
    pPVar8 = (this->prims0).items;
    if (pPVar8 != (PrimRef *)0x0) {
      ctx = (EVP_PKEY_CTX *)(sVar19 << 5);
      if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
        alignedFree(pPVar8);
      }
      else {
        os_free(pPVar8,(size_t)ctx,(this->prims0).alloc.hugepages);
      }
    }
    if (sVar19 != 0) {
      pMVar9 = (prims->alloc).device;
      ctx = (EVP_PKEY_CTX *)(sVar19 * -0x20);
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,ctx,1);
    }
    *local_e8 = 0;
    local_e8[1] = 0;
    local_e8[2] = 0;
  }
  BVHN<4>::cleanup(*ppBVar27,ctx);
  BVHN<4>::postBuild(*ppBVar27,local_e0);
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

	/* skip build for empty scene */
        const size_t numOriginalPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(Mesh::geom_type,false);
        numPreviousPrimitives = numOriginalPrimitives;
        if (numOriginalPrimitives == 0) {
          prims0.clear();
          bvh->clear();
          return;
        }

        const unsigned int maxGeomID = mesh ? geomID_ : scene->getMaxGeomID<Mesh,false>();
        const bool usePreSplits = scene->device->useSpatialPreSplits || (maxGeomID >= ((unsigned int)1 << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)));
        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + (usePreSplits ? "BuilderFastSpatialPresplitSAH" : "BuilderFastSpatialSAH"));

        /* create primref array */
        const size_t numSplitPrimitives = max(numOriginalPrimitives,size_t(splitFactor*numOriginalPrimitives));
        prims0.resize(numSplitPrimitives);

        /* enable os_malloc for two level build */
        if (mesh)
          bvh->alloc.setOSallocation(true);
	
	NodeRef root(0);
	PrimInfo pinfo;
	

        if (likely(usePreSplits))
	  {		     
            /* spatial presplit SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray_presplit<Mesh,Splitter>(mesh,maxGeomID,numOriginalPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray_presplit<Mesh,Splitter>(scene,Mesh::geom_type,false,numOriginalPrimitives,prims0,bvh->scene->progressInterface);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeafSpatial<N,Primitive>(bvh),bvh->scene->progressInterface,prims0.data(),pinfo,settings);
	  }
	else
	  {
            /* standard spatial split SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray(mesh,geomID_,numSplitPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray(scene,Mesh::geom_type,false,numSplitPrimitives,prims0,bvh->scene->progressInterface);
	
	    Splitter splitter(scene);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHBuilderBinnedFastSpatialSAH::build<NodeRef>(
								  typename BVH::CreateAlloc(bvh),
								  typename BVH::AABBNode::Create2(),
								  typename BVH::AABBNode::Set2(),
								  CreateLeafSpatial<N,Primitive>(bvh),
								  splitter,
								  bvh->scene->progressInterface,
								  prims0.data(),
								  numSplitPrimitives,
								  pinfo,settings);

	    /* ==================== */
	  }

        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

	/* clear temporary data for static geometry */
	if (scene && scene->isStaticAccel()) {
          prims0.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }